

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_logger.cpp
# Opt level: O1

void __thiscall
ot::commissioner::SysLogger::Log(SysLogger *this,LogLevel aLevel,string *aRegion,string *aMsg)

{
  int __pri;
  string ret;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  if (aLevel <= this->mLogLevel) {
    if (kDebug < aLevel) {
      abort();
    }
    __pri = *(int *)(&DAT_0030bcf0 + (ulong)aLevel * 4);
    local_38 = 0;
    local_30[0] = 0;
    local_40 = local_30;
    std::__cxx11::string::_M_replace
              ((ulong)&local_40,0,(char *)0x0,
               (ulong)(&DAT_0030bd08 + *(int *)(&DAT_0030bd08 + (ulong)aLevel * 4)));
    syslog(__pri,"%s [ %s ] %s",local_40,(aRegion->_M_dataplus)._M_p,(aMsg->_M_dataplus)._M_p);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
  }
  return;
}

Assistant:

void SysLogger::Log(LogLevel aLevel, const std::string &aRegion, const std::string &aMsg)
{
    if (aLevel <= mLogLevel)
    {
        syslog(ToSysLogLevel(aLevel), "%s [ %s ] %s", ToString(aLevel).c_str(), aRegion.c_str(), aMsg.c_str());
    }
}